

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,string *file_name)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *__s;
  logic_error *plVar6;
  size_type sVar7;
  ulong uVar8;
  element_t *peVar9;
  reference __str;
  size_t sVar10;
  double dVar11;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  ulong local_500;
  size_t j;
  size_t i;
  undefined1 local_4e8 [4];
  int index;
  string_type local_4d0;
  undefined1 local_4b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  string_type local_478;
  undefined1 local_458 [8];
  cmatch results;
  regex rx;
  undefined1 local_410 [12];
  undefined1 local_400 [12];
  string local_3f0 [8];
  string str;
  string local_3c8 [32];
  ostringstream local_3a8 [8];
  ostringstream str_stream;
  long local_220;
  ifstream ifs;
  string *file_name_local;
  matrix<double> *this_local;
  
  base_matrix<double>::base_matrix(&this->super_base_matrix<double>);
  this->rows__ = 0;
  this->columns__ = 0;
  this->elements__ = (element_t *)0x0;
  std::ifstream::ifstream(&local_220,file_name,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_3a8);
    poVar5 = std::operator<<((ostream *)local_3a8,"cannot open file \"");
    poVar5 = std::operator<<(poVar5,(string *)file_name);
    poVar5 = std::operator<<(poVar5,"\"! (");
    poVar5 = std::operator<<(poVar5,"matrix");
    poVar5 = std::operator<<(poVar5,"() in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11e);
    std::operator<<(poVar5,")");
    str.field_2._M_local_buf[0xf] = '\x01';
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::logic_error::logic_error(plVar6,local_3c8);
    str.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_400,
             (istream_type *)&local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_410);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_400._0_8_;
  __beg._M_c = local_400._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_410._0_8_;
  __end._M_c = local_410._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_3f0,__beg,__end,
             (allocator<char> *)
             ((long)&rx._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rx._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin,
             "mat_lib::matrix\\[(\\d+)x(\\d)\\]\\{\\n\\s*(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\n\\}"
             ,0x10);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_458);
  __s = (char *)std::__cxx11::string::c_str();
  bVar3 = std::
          regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                    (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)local_458,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin,0);
  if (!bVar3) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"the file are incorrect: bad expresion");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_478,
        (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
        local_458,1);
  iVar4 = std::__cxx11::stoi(&local_478,(size_t *)0x0,10);
  this->rows__ = (long)iVar4;
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str((string_type *)
        &numbers.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage,
        (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
        local_458,2);
  iVar4 = std::__cxx11::stoi((string *)
                             &numbers.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t *)0x0,10);
  this->columns__ = (long)iVar4;
  std::__cxx11::string::~string
            ((string *)
             &numbers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4b0);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_4d0,
        (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
        local_458,3);
  boost::algorithm::is_any_of<char[6]>((is_any_ofF<char> *)local_4e8,(char (*) [6])"(,|\n)");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4b0,&local_4d0,(is_any_ofF<char> *)local_4e8,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)local_4e8);
  std::__cxx11::string::~string((string *)&local_4d0);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4b0);
  if (sVar7 != this->rows__ * this->columns__) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"the file are incorrect: bad declaration of matrix");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->rows__ * this->columns__;
  uVar8 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  peVar9 = (element_t *)operator_new__(uVar8);
  this->elements__ = peVar9;
  i._4_4_ = 0;
  for (j = 0; j < this->rows__; j = j + 1) {
    for (local_500 = 0; local_500 < this->columns__; local_500 = local_500 + 1) {
      __str = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_4b0,(long)i._4_4_);
      dVar11 = std::__cxx11::stod(__str,(size_t *)0x0);
      peVar9 = this->elements__;
      sVar10 = offset__(this,j,(int)local_500);
      peVar9[sVar10] = dVar11;
      i._4_4_ = i._4_4_ + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4b0);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_458);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&results._M_begin);
  std::__cxx11::string::~string(local_3f0);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

matrix<T>::matrix(const string& file_name) // constructor from a file
  : rows__{0},
    columns__{0},
    elements__{nullptr}
  {
    ifstream ifs(file_name);
    if(!ifs)
    {
      ostringstream str_stream;
      str_stream<<"cannot open file \""<<file_name<<"\"! ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw logic_error(str_stream.str());
    }

    string str((istreambuf_iterator<char>(ifs)),
               istreambuf_iterator<char>());

    regex rx(R"(mat_lib::matrix\[(\d+)x(\d)\]\{\n\s*(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\n\})");
    cmatch results;
    if (not regex_match(str.c_str(),results,rx)) {
        throw logic_error("the file are incorrect: bad expresion");
    }

    rows__ = stoi(results.str(1));
    columns__ = stoi(results.str(2));
    vector<string> numbers;
    boost::split(numbers, results.str(3), boost::is_any_of("(,|\n)"));


    if (numbers.size() != rows__*columns__) {
      throw logic_error("the file are incorrect: bad declaration of matrix");
    }

    elements__ = new element_t[rows__*columns__];

    int index = 0;
    for(size_t i=0; i<rows__; i++){
      for(size_t j=0; j<columns__; j++) {
          elements__[offset__(i, j)] = stod(numbers[index]);
          index++;
      }
    }
  }